

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_factory.cpp
# Opt level: O2

unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> __thiscall
n_e_s::core::RomFactory::from_bytes(RomFactory *this,istream *bytestream)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  size_type __n;
  long *plVar4;
  invalid_argument *piVar5;
  logic_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  long lVar6;
  ulong uVar7;
  string_view fmt;
  format_args args;
  undefined1 local_c8 [16];
  string local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chr_memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prg_rom;
  ulong local_48 [3];
  
  std::istream::seekg((long)bytestream,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg((long)bytestream,_S_beg);
  if ((long)__n < 0) {
    __assert_fail("size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/rom_factory.cpp"
                  ,0x1b,"size_t (anonymous namespace)::streamsize(std::istream &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bytes,__n,(allocator_type *)(local_c8 + 0x10));
  if ((ulong)((long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x10) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"File isn\'t big enough to contain a header");
  }
  else {
    plVar4 = (long *)std::istream::read((char *)bytestream,
                                        (long)bytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      local_c8._0_4_ = 0x1a53454e;
      local_c8._8_4_ = local_c8._8_4_ & 0xffffff;
      local_c8._12_4_ = 0;
      bVar3 = std::__equal<true>::equal<unsigned_char>
                        (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4,local_c8);
      if (!bVar3) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar5,"No valid iNes header");
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_c8._0_4_ =
           *(undefined4 *)
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + 4);
      local_c8._8_4_ =
           *(undefined4 *)
            (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 8);
      local_c8._12_4_ =
           *(undefined4 *)
            (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 0xc);
      if (local_c8[8] == '\0') {
        local_c8._9_3_ = (undefined3)((uint)local_c8._8_4_ >> 8);
        local_c8[8] = 1;
      }
      local_c8[4] = (byte)uVar1;
      lVar6 = (ulong)local_c8[4] * 0x4000;
      local_c8[5] = (byte)(uVar1 >> 8);
      uVar7 = (ulong)local_c8[5];
      local_c8._4_4_ = uVar1;
      if ((long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == lVar6 + uVar7 * 0x2000 + 0x10) {
        local_c8[6] = (byte)(uVar1 >> 0x10);
        bVar2 = local_c8[6];
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&prg_rom,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x10),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar6 + 0x10),
                   (allocator_type *)(local_c8 + 0x10));
        chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (local_c8[5] == '\0') {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&chr_memory,0x2000);
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_c8 + 0x10),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6 + 0x10),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar7 * 0x2000 + 0x10 + lVar6),
                     (allocator_type *)local_48);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&chr_memory,
                     (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (local_c8 + 0x10));
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (local_c8 + 0x10));
        }
        uVar7 = (ulong)(uVar1 >> 0x18 & 0xf0) | (ulong)(bVar2 >> 4);
        if ((char)uVar7 == '\x02') {
          std::
          make_unique<n_e_s::core::Mapper2,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((INesHeader *)(local_c8 + 0x10),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&prg_rom);
        }
        else {
          if ((uVar1 & 0xf0000000) != 0 || bVar2 >> 4 != 0) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            fmt.size_ = 2;
            fmt.data_ = (char *)0x16;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_48;
            local_48[0] = uVar7;
            ::fmt::v8::vformat_abi_cxx11_
                      ((string *)(local_c8 + 0x10),(v8 *)"Unsupported mapper: {}",fmt,args);
            std::logic_error::logic_error(this_00,(string *)(local_c8 + 0x10));
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          std::
          make_unique<n_e_s::core::Nrom,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ((INesHeader *)(local_c8 + 0x10),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&prg_rom);
        }
        *(pointer *)this = local_b8._M_dataplus._M_p;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&prg_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return (__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>
                )(__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>
                  )this;
      }
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Unexpected rom size");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Unable to get bytes");
  }
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<IRom> RomFactory::from_bytes(std::istream &bytestream) {
    std::vector<uint8_t> bytes(streamsize(bytestream));
    if (bytes.size() < 16) {
        throw std::invalid_argument(
                "File isn't big enough to contain a header");
    }

    if (!bytestream.read(reinterpret_cast<char *>(&bytes[0]), bytes.size())) {
        throw std::invalid_argument("Unable to get bytes");
    }

    INesHeader h;
    if (!std::equal(bytes.begin(), bytes.begin() + sizeof(h.nes), h.nes)) {
        throw std::invalid_argument("No valid iNes header");
    }

    // This is fine because the header is exactly 16 bytes with no padding.
    memcpy(&h, &bytes[0], sizeof(h));
    if (h.prg_ram_size == 0) {
        h.prg_ram_size = 1; // For compatibility reasons, 0 ram means 1 ram.
    }

    uint8_t mapper = static_cast<uint8_t>(h.flags_6 & 0xF0u) >> 4u;
    mapper |= h.flags_7 & 0xF0u;

    const auto prg_rom_byte_count =
            static_cast<uint32_t>(h.prg_rom_size * 16 * 1024);
    const auto chr_rom_byte_count =
            static_cast<uint32_t>(h.chr_rom_size * 8 * 1024);

    const uint32_t expected_rom_size =
            sizeof(INesHeader) + prg_rom_byte_count + chr_rom_byte_count;
    if (bytes.size() != expected_rom_size) {
        throw std::invalid_argument("Unexpected rom size");
    }

    std::vector<uint8_t> prg_rom(bytes.begin() + sizeof(INesHeader),
            bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count);

    std::vector<uint8_t> chr_memory;
    if (h.chr_rom_size == 0) {
        // No chr rom, game uses chr ram
        // Allocate ram with enough size:
        // https://www.nesdev.org/wiki/CHR_ROM_vs._CHR_RAM
        chr_memory.resize(static_cast<std::size_t>(8u * 1024u));
    } else {
        chr_memory = std::vector<uint8_t>(
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count,
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count +
                        chr_rom_byte_count);
    }

    if (mapper == 0) {
        return std::make_unique<Nrom>(h, prg_rom, chr_memory);
    }
    if (mapper == 2) {
        return std::make_unique<Mapper2>(h, prg_rom, chr_memory);
    }

    throw std::logic_error(fmt::format("Unsupported mapper: {}", mapper));
}